

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

ostream * duckdb_parquet::operator<<(ostream *out,type *val)

{
  type tVar1;
  char *__s;
  size_t sVar2;
  undefined *puVar3;
  undefined *puVar4;
  
  tVar1 = *val;
  puVar3 = &DAT_02532b90;
  if (DAT_02532b98 != (undefined *)0x0) {
    puVar3 = &DAT_02532b90;
    puVar4 = DAT_02532b98;
    do {
      if ((int)tVar1 <= *(int *)(puVar4 + 0x20)) {
        puVar3 = puVar4;
      }
      puVar4 = *(undefined **)(puVar4 + (ulong)(*(int *)(puVar4 + 0x20) < (int)tVar1) * 8 + 0x10);
    } while (puVar4 != (undefined *)0x0);
  }
  puVar4 = &DAT_02532b90;
  if ((puVar3 != &DAT_02532b90) && (puVar4 = &DAT_02532b90, *(int *)(puVar3 + 0x20) <= (int)tVar1))
  {
    puVar4 = puVar3;
  }
  if (puVar4 == &DAT_02532b90) {
    std::ostream::operator<<(out,tVar1);
  }
  else {
    __s = *(char **)(puVar4 + 0x28);
    if (__s == (char *)0x0) {
      std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(out,__s,sVar2);
    }
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const ConvertedType::type& val) {
  std::map<int, const char*>::const_iterator it = _ConvertedType_VALUES_TO_NAMES.find(val);
  if (it != _ConvertedType_VALUES_TO_NAMES.end()) {
    out << it->second;
  } else {
    out << static_cast<int>(val);
  }
  return out;
}